

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_loremaster.cpp
# Opt level: O3

int AF_A_LoremasterChain(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClassActor *pPVar6;
  AActor *ent;
  char *__assertion;
  bool bVar7;
  DVector2 v;
  FName local_5c;
  double local_58;
  FSoundID local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f585f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_005f55dc:
        ent = (AActor *)0x0;
      }
      else {
        pPVar5 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (ent->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f585f;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005f569c;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005f584f;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar5;
            }
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar7) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar7 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar7) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f585f;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005f584f;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f569c:
        local_4c.ID = S_FindSound("loremaster/active");
        S_Sound(ent,4,&local_4c,1.0,1.0);
        local_5c.Index = FName::NameManager::FindName(&FName::NameData,"LoreShot2",false);
        local_48.X = (ent->__Pos).X;
        local_48.Y = (ent->__Pos).Y;
        local_48.Z = (ent->__Pos).Z;
        pPVar6 = ClassForSpawn(&local_5c);
        AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        iVar4 = FName::NameManager::FindName(&FName::NameData,"LoreShot2",false);
        local_58 = (ent->Vel).Z * -0.5;
        P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,(ent->Vel).X * -0.5,(ent->Vel).Y * -0.5);
        local_48.Z = local_58 + (ent->__Pos).Z;
        local_5c.Index = iVar4;
        pPVar6 = ClassForSpawn(&local_5c);
        AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        iVar4 = FName::NameManager::FindName(&FName::NameData,"LoreShot2",false);
        local_58 = (ent->Vel).Z;
        P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,-(ent->Vel).X,-(ent->Vel).Y);
        local_48.Z = (ent->__Pos).Z - local_58;
        local_5c.Index = iVar4;
        pPVar6 = ClassForSpawn(&local_5c);
        AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005f585f;
    }
    if (ent == (AActor *)0x0) goto LAB_005f55dc;
  }
LAB_005f584f:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f585f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_loremaster.cpp"
                ,0x24,"int AF_A_LoremasterChain(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LoremasterChain)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_BODY, "loremaster/active", 1, ATTN_NORM);
	Spawn("LoreShot2", self->Pos(), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel/2.), ALLOW_REPLACE);
	Spawn("LoreShot2", self->Vec3Offset(-self->Vel), ALLOW_REPLACE);
	return 0;
}